

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O1

__pid_t __thiscall sznet::CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  MutexLock *mutex;
  __pid_t extraout_EAX;
  MutexLockGuard lock;
  
  mutex = &this->m_mutex;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  while (0 < this->m_count) {
    Condition::wait(&this->m_condition,__stat_loc);
  }
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  return extraout_EAX;
}

Assistant:

void CountDownLatch::wait()
{
	MutexLockGuard lock(m_mutex);
	while (m_count > 0)
	{
		m_condition.wait();
	}
}